

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_columnref.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformStarExpression(Transformer *this,PGAStar *star)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  __hashtable *__h;
  size_t sVar5;
  pointer pSVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  type a;
  BaseExpression *this_00;
  StarExpression *pSVar10;
  pointer pPVar11;
  type expr;
  ParserException *pPVar12;
  _Hash_node_base *in_RDX;
  _Hash_node_base *p_Var13;
  templated_unique_single_t result;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  replace_expression;
  optional_ptr<duckdb_libpgquery::PGList,_true> exclude_column_list;
  string replace_entry;
  optional_ptr<duckdb_libpgquery::PGValue,_true> value;
  QualifiedColumnName exclude_column;
  _Head_base<0UL,_duckdb::StarExpression_*,_false> local_280;
  undefined1 local_278 [8];
  optional_ptr<duckdb_libpgquery::PGList,_true> local_270;
  __node_base_ptr local_268;
  undefined1 local_260 [24];
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  _Hash_node_base *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Alloc_hider local_208;
  __node_base_ptr local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  key_type local_1e8;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_1c8;
  undefined1 local_1c0 [16];
  ParsedExpression local_1b0;
  __node_base_ptr local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  __node_base local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  StarExpression *local_140;
  __node_base_ptr local_138;
  uint local_130;
  undefined4 uStack_12c;
  ExpressionType EStack_128;
  ExpressionClass EStack_127;
  undefined2 uStack_126;
  undefined4 uStack_124;
  _Alloc_hider local_120;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  char local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  p_Var13 = in_RDX[1]._M_nxt;
  local_260._16_8_ = in_RDX;
  local_248._0_8_ = &local_238;
  local_120._M_p = (pointer)star;
  local_118._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
  if (p_Var13 == (_Hash_node_base *)0x0) {
    local_248._8_8_ = 0;
    local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    sVar5 = strlen((char *)p_Var13);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_248,p_Var13,(char *)((long)&p_Var13->_M_nxt + sVar5));
  }
  local_280._M_head_impl = (StarExpression *)operator_new(0x110);
  local_1c0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_1c0 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &local_238) {
    local_1c0._0_8_ = local_248._0_8_;
  }
  local_1b0.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_238._M_allocated_capacity;
  local_1c0._8_8_ = local_248._8_8_;
  local_248._8_8_ = 0;
  local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
  local_248._0_8_ = &local_238;
  StarExpression::StarExpression(local_280._M_head_impl,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &local_238) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((((_Hash_node_base *)(local_260._16_8_ + 0x18))->_M_nxt != (_Hash_node_base *)0x0) &&
     (p_Var13 = ((_Hash_node_base *)(local_260._16_8_ + 0x18))->_M_nxt[1]._M_nxt,
     p_Var13 != (_Hash_node_base *)0x0)) {
    do {
      local_270.ptr = (PGList *)p_Var13->_M_nxt;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_270);
      TransformQualifiedColumnName((QualifiedColumnName *)local_1c0,local_270.ptr);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,(QualifiedColumnName *)local_1c0);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_248._0_8_ = &local_238;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"Duplicate entry \"%s\" in EXCLUDE list","");
        QualifiedColumnName::ToString_abi_cxx11_(&local_50,(QualifiedColumnName *)local_1c0);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_248,&local_50);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_248._0_8_ = &pSVar6->exclude_list;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::QualifiedColumnName,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::QualifiedColumnName,true>>>>
                ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_248._0_8_,(QualifiedColumnName *)local_1c0,local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.query_location.index != &local_170) {
        operator_delete((void *)local_1b0.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.alias._M_dataplus._M_p !=
          &local_1b0.super_BaseExpression.alias.field_2) {
        operator_delete(local_1b0.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_);
      }
      p_Var13 = p_Var13[1]._M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  if ((((_Hash_node_base *)(local_260._16_8_ + 0x20))->_M_nxt != (_Hash_node_base *)0x0) &&
     (p_Var13 = ((_Hash_node_base *)(local_260._16_8_ + 0x20))->_M_nxt[1]._M_nxt,
     p_Var13 != (_Hash_node_base *)0x0)) {
    do {
      local_270.ptr = (PGList *)p_Var13->_M_nxt;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_270);
      TransformExpression((Transformer *)local_278,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)local_120._M_p);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_270);
      local_1c8.ptr = *(PGList **)(((string *)&(local_270.ptr)->tail)->_M_dataplus)._M_p;
      optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_1c8);
      ::std::__cxx11::string::string
                ((string *)local_248,(char *)(local_1c8.ptr)->head,(allocator *)local_1c0);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar6->replace_list)._M_h,(key_type *)local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Duplicate entry \"%s\" in REPLACE list","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_248._0_8_,(char *)(local_248._0_8_ + local_248._8_8_));
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_1c0,&local_d0);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_110._M_allocated_capacity = (size_type)local_100;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_248._0_8_,(char *)(local_248._0_8_ + local_248._8_8_));
      QualifiedColumnName::QualifiedColumnName
                ((QualifiedColumnName *)local_1c0,(string *)&local_110);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,(QualifiedColumnName *)local_1c0);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.query_location.index != &local_170) {
        operator_delete((void *)local_1b0.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.alias._M_dataplus._M_p !=
          &local_1b0.super_BaseExpression.alias.field_2) {
        operator_delete(local_1b0.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_);
      }
      if ((char *)local_110._M_allocated_capacity != local_100) {
        operator_delete((void *)local_110._M_allocated_capacity);
      }
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Column \"%s\" cannot occur in both EXCLUDE and REPLACE list"
                   ,"");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_248._0_8_,(char *)(local_248._0_8_ + local_248._8_8_));
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_1c0,&local_f0);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_1c0._0_8_ = local_1c0 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        local_1c0._0_8_ = local_248._0_8_;
      }
      local_1b0.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)local_238._M_allocated_capacity;
      local_1c0._8_8_ = local_248._8_8_;
      local_248._8_8_ = 0;
      local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
      local_1b0.super_BaseExpression.alias._M_dataplus._M_p = (pointer)local_278;
      local_278 = (undefined1  [8])0x0;
      local_248._0_8_ = &local_238;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar6->replace_list,(QualifiedColumnName *)local_1c0);
      if ((long *)local_1b0.super_BaseExpression.alias._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_1b0.super_BaseExpression.alias._M_dataplus._M_p + 8))();
      }
      local_1b0.super_BaseExpression.alias._M_dataplus._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_);
      }
      if (local_278 != (undefined1  [8])0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_278)->ptr->options)();
      }
      p_Var13 = p_Var13[1]._M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  if ((((_Hash_node_base *)(local_260._16_8_ + 0x28))->_M_nxt != (_Hash_node_base *)0x0) &&
     (p_Var13 = ((_Hash_node_base *)(local_260._16_8_ + 0x28))->_M_nxt[1]._M_nxt,
     p_Var13 != (_Hash_node_base *)0x0)) {
    paVar1 = &local_1b0.super_BaseExpression.alias.field_2;
    do {
      local_278 = (undefined1  [8])p_Var13->_M_nxt;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_278);
      local_1c8.ptr = *(PGList **)*(ParserOptions **)((long)local_278 + 8);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_1c8);
      TransformQualifiedColumnName((QualifiedColumnName *)local_248,local_1c8.ptr);
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_278);
      ::std::__cxx11::string::string
                ((string *)&local_270,(char *)**(undefined8 **)((long)local_278 + 0x10),
                 (allocator *)local_1c0);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar9 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar6->rename_list)._M_h,(key_type *)local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Duplicate entry \"%s\" in EXCLUDE list","");
        QualifiedColumnName::ToString_abi_cxx11_(&local_70,(QualifiedColumnName *)local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_1c0,&local_70);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar7 = ::std::
              _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(pSVar6->exclude_list)._M_h,(key_type *)local_248);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar7.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
          (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Column \"%s\" cannot occur in both EXCLUDE and RENAME list",
                   "");
        QualifiedColumnName::ToString_abi_cxx11_(&local_90,(QualifiedColumnName *)local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_1c0,&local_90);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      iVar8 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pSVar6->replace_list)._M_h,&local_1e8);
      unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
      operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                  *)&local_280);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        pPVar12 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Column \"%s\" cannot occur in both REPLACE and RENAME list",
                   "");
        QualifiedColumnName::ToString_abi_cxx11_(&local_b0,(QualifiedColumnName *)local_248);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar12,(string *)local_1c0,&local_b0);
        __cxa_throw(pPVar12,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      local_1c0._0_8_ = local_1c0 + 0x10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        local_1c0._0_8_ = local_248._0_8_;
      }
      local_1b0.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)local_238._M_allocated_capacity;
      local_1c0._8_8_ = local_248._8_8_;
      local_248._8_8_ = 0;
      local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p == &local_218) {
        local_1b0.super_BaseExpression.alias.field_2._8_4_ = local_218._8_4_;
        local_1b0.super_BaseExpression.alias.field_2._12_4_ = local_218._12_4_;
        local_1b0.super_BaseExpression.alias._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1b0.super_BaseExpression.alias._M_dataplus._M_p = local_228._M_p;
      }
      local_1b0.super_BaseExpression.alias.field_2._M_allocated_capacity._4_4_ =
           local_218._M_allocated_capacity._4_4_;
      local_1b0.super_BaseExpression.alias.field_2._M_allocated_capacity._0_4_ =
           local_218._M_allocated_capacity._0_4_;
      local_1b0.super_BaseExpression.alias._M_string_length = (size_type)local_220;
      local_220 = (_Hash_node_base *)0x0;
      local_218._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1b0.super_BaseExpression.query_location.index = (idx_t)&local_170;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_p == &local_1f8) {
        local_170._8_4_ = local_1f8._8_4_;
        local_170._12_4_ = local_1f8._12_4_;
      }
      else {
        local_1b0.super_BaseExpression.query_location.index = (idx_t)local_208._M_p;
      }
      local_170._M_allocated_capacity._4_4_ = local_1f8._M_allocated_capacity._4_4_;
      local_170._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_;
      local_178 = local_200;
      local_200 = (__node_base_ptr)0x0;
      local_1f8._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_ & 0xffffff00;
      local_160._M_p = (pointer)&local_150;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) {
        local_150._8_4_ = local_1e8.field_2._8_4_;
        local_150._12_4_ = local_1e8.field_2._12_4_;
      }
      else {
        local_160._M_p = local_1e8._M_dataplus._M_p;
      }
      local_150._M_allocated_capacity._4_4_ = local_1e8.field_2._M_allocated_capacity._4_4_;
      local_150._M_allocated_capacity._0_4_ = local_1e8.field_2._M_allocated_capacity._0_4_;
      local_158._M_nxt = (_Hash_node_base *)local_1e8._M_string_length;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity._0_4_ =
           local_1e8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if ((StarExpression *)local_270.ptr == (StarExpression *)local_260) {
        EStack_128 = local_260[8];
        EStack_127 = local_260[9];
        uStack_126 = local_260._10_2_;
        uStack_124 = local_260._12_4_;
        local_140 = (StarExpression *)&local_130;
      }
      else {
        local_140 = (StarExpression *)local_270.ptr;
      }
      _local_130 = (pointer)CONCAT44(local_260._4_4_,local_260._0_4_);
      local_138 = local_268;
      local_268 = (__node_base_ptr)0x0;
      local_260._0_4_ = local_260._0_4_ & 0xffffff00;
      local_270.ptr = (PGList *)local_260;
      local_248._0_8_ = &local_238;
      local_228._M_p = (pointer)&local_218;
      local_208._M_p = (pointer)&local_1f8;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::QualifiedColumnName,std::__cxx11::string>>
                ((_Hashtable<duckdb::QualifiedColumnName,std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>,std::allocator<std::pair<duckdb::QualifiedColumnName_const,std::__cxx11::string>>,std::__detail::_Select1st,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pSVar6->rename_list,local_1c0);
      if (local_140 != (StarExpression *)&local_130) {
        operator_delete(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.query_location.index != &local_170) {
        operator_delete((void *)local_1b0.super_BaseExpression.query_location.index);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.super_BaseExpression.alias._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0.super_BaseExpression.alias._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_);
      }
      if ((StarExpression *)local_270.ptr != (StarExpression *)local_260) {
        operator_delete(local_270.ptr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_p != &local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_);
      }
      p_Var13 = p_Var13[1]._M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  if (((_Hash_node_base *)(local_260._16_8_ + 0x10))->_M_nxt != (_Hash_node_base *)0x0) {
    TransformExpression((Transformer *)local_1c0,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)local_120._M_p);
    pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                         *)&local_280);
    uVar3 = local_1c0._0_8_;
    local_1c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    _Var2._M_head_impl =
         (pSVar6->expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar6->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar3;
    if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._0_8_)->_M_allocated_capacity + 8))();
    }
    pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
             operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                         *)&local_280);
    a = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
        operator*(&pSVar6->expr);
    bVar4 = StarExpression::IsStar(a);
    if (bVar4) {
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pSVar6->expr)->super_BaseExpression;
      pSVar10 = BaseExpression::Cast<duckdb::StarExpression>(this_00);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::__cxx11::string::_M_assign((string *)&pSVar6->relation_name);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_move_assign(&(pSVar6->exclude_list)._M_h,&pSVar10->exclude_list);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&(pSVar6->replace_list)._M_h,&pSVar10->replace_list);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign(&(pSVar6->rename_list)._M_h,&pSVar10->rename_list);
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      _Var2._M_head_impl =
           (pSVar6->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pSVar6->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
    }
    else {
      pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
               ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                             *)&local_280);
      pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(&pSVar6->expr);
      if ((pPVar11->super_BaseExpression).type == LAMBDA) {
        local_248._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_248._8_8_ = 0;
        local_238._M_allocated_capacity = 0;
        pSVar10 = (StarExpression *)operator_new(0x110);
        local_1c0._8_8_ = (ParserOptions *)0x0;
        local_1b0.super_BaseExpression._vptr_BaseExpression =
             (_func_int **)
             ((ulong)local_1b0.super_BaseExpression._vptr_BaseExpression & 0xffffffffffffff00);
        local_1c0._0_8_ = (ParsedExpression *)(local_1c0 + 0x10);
        StarExpression::StarExpression(pSVar10,(string *)local_1c0);
        if ((ParsedExpression *)local_1c0._0_8_ != (ParsedExpression *)(local_1c0 + 0x10)) {
          operator_delete((void *)local_1c0._0_8_);
        }
        local_270.ptr = (PGList *)pSVar10;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_248,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_270);
        if ((StarExpression *)local_270.ptr != (StarExpression *)0x0) {
          (**(code **)(*(long *)local_270.ptr + 8))();
        }
        pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                               *)&local_280);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)local_248,&pSVar6->expr);
        make_uniq<duckdb::FunctionExpression,char_const(&)[12],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)local_1c0,(char (*) [12])"list_filter",
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)local_248);
        uVar3 = local_1c0._0_8_;
        local_1c0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                 ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                               *)&local_280);
        _Var2._M_head_impl =
             (pSVar6->expr).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pSVar6->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar3;
        if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._0_8_)->_M_allocated_capacity + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)local_248);
      }
    }
  }
  bVar4 = *(bool *)&((_Hash_node_base *)(local_260._16_8_ + 0x30))->_M_nxt;
  pSVar6 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
           operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                       *)&local_280);
  pSVar6->columns = bVar4;
  expr = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>::
         operator*((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                    *)&local_280);
  SetQueryLocation(&expr->super_ParsedExpression,
                   *(int *)((long)&((_Hash_node_base *)(local_260._16_8_ + 0x30))->_M_nxt + 4));
  *(StarExpression **)
   local_118._M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_280._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_118._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformStarExpression(duckdb_libpgquery::PGAStar &star) {
	auto result = make_uniq<StarExpression>(star.relation ? star.relation : string());
	if (star.except_list) {
		for (auto head = star.except_list->head; head; head = head->next) {
			auto exclude_column_list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			auto exclude_column = TransformQualifiedColumnName(*exclude_column_list);
			// qualified - add to exclude list
			if (result->exclude_list.find(exclude_column) != result->exclude_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", exclude_column.ToString());
			}
			result->exclude_list.insert(std::move(exclude_column));
		}
	}
	if (star.replace_list) {
		for (auto head = star.replace_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto replace_expression =
			    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(list->head->data.ptr_value));
			auto value = PGPointerCast<duckdb_libpgquery::PGValue>(list->tail->data.ptr_value);
			D_ASSERT(value->type == duckdb_libpgquery::T_PGString);
			string replace_entry = value->val.str;
			if (result->replace_list.find(replace_entry) != result->replace_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in REPLACE list", replace_entry);
			}
			if (result->exclude_list.find(QualifiedColumnName(replace_entry)) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and REPLACE list", replace_entry);
			}
			result->replace_list.insert(make_pair(std::move(replace_entry), std::move(replace_expression)));
		}
	}
	if (star.rename_list) {
		for (auto head = star.rename_list->head; head; head = head->next) {
			auto list = PGPointerCast<duckdb_libpgquery::PGList>(head->data.ptr_value);
			D_ASSERT(list->length == 2);
			auto rename_column_list = PGPointerCast<duckdb_libpgquery::PGList>(list->head->data.ptr_value);
			auto rename_column = TransformQualifiedColumnName(*rename_column_list);
			string new_name = char_ptr_cast(list->tail->data.ptr_value);
			if (result->rename_list.find(rename_column) != result->rename_list.end()) {
				throw ParserException("Duplicate entry \"%s\" in EXCLUDE list", rename_column.ToString());
			}
			if (result->exclude_list.find(rename_column) != result->exclude_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both EXCLUDE and RENAME list",
				                      rename_column.ToString());
			}
			if (result->replace_list.find(rename_column.column) != result->replace_list.end()) {
				throw ParserException("Column \"%s\" cannot occur in both REPLACE and RENAME list",
				                      rename_column.ToString());
			}
			result->rename_list.insert(make_pair(std::move(rename_column), std::move(new_name)));
		}
	}
	if (star.expr) {
		D_ASSERT(star.columns);
		D_ASSERT(result->relation_name.empty());
		D_ASSERT(result->exclude_list.empty());
		D_ASSERT(result->replace_list.empty());
		result->expr = TransformExpression(star.expr);
		if (StarExpression::IsStar(*result->expr)) {
			auto &child_star = result->expr->Cast<StarExpression>();
			result->relation_name = child_star.relation_name;
			result->exclude_list = std::move(child_star.exclude_list);
			result->replace_list = std::move(child_star.replace_list);
			result->rename_list = std::move(child_star.rename_list);
			result->expr.reset();
		} else if (result->expr->GetExpressionType() == ExpressionType::LAMBDA) {
			vector<unique_ptr<ParsedExpression>> children;
			children.push_back(make_uniq<StarExpression>());
			children.push_back(std::move(result->expr));
			auto list_filter = make_uniq<FunctionExpression>("list_filter", std::move(children));
			result->expr = std::move(list_filter);
		}
	}
	result->columns = star.columns;
	SetQueryLocation(*result, star.location);
	return std::move(result);
}